

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_NurbsCurve::GetNextDiscontinuity
          (ON_NurbsCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  continuity cVar9;
  int span_index;
  int iVar10;
  double *pdVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  double *t_00;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector D1m;
  ON_3dVector D1p;
  int tmp_dtype;
  int tmp_hint;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector local_b0;
  ON_3dVector D2m;
  ON_3dVector D2p;
  double tmp_t;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  
  tmp_hint = 0;
  tmp_dtype = 0;
  Km.z = ON_3dVector::NanVector.z;
  Km.x = ON_3dVector::NanVector.x;
  Km.y = ON_3dVector::NanVector.y;
  Kp.z = ON_3dVector::NanVector.z;
  Kp.x = ON_3dVector::NanVector.x;
  Kp.y = ON_3dVector::NanVector.y;
  if (hint == (int *)0x0) {
    hint = &tmp_hint;
  }
  if (dtype == (int *)0x0) {
    dtype = &tmp_dtype;
  }
  t_00 = &tmp_t;
  if (t != (double *)0x0) {
    t_00 = t;
  }
  if (c == C0_continuous) {
    return false;
  }
  dVar21 = t0;
  if (c == C0_locus_continuous) {
    c = C0_locus_continuous;
  }
  else {
    if ((t0 == t1) && (!NAN(t0) && !NAN(t1))) {
      return false;
    }
    if (this->m_order < 3) {
      c = ON::PolylineContinuity(c);
    }
    cVar9 = ON::ParametricContinuity(c);
    if ((cVar9 < (Gsmooth_continuous|C0_continuous)) && ((0x1028U >> (cVar9 & 0x1f) & 1) != 0)) {
      iVar15 = this->m_order;
      bVar6 = 2 < iVar15;
    }
    else {
      iVar15 = this->m_order;
      bVar6 = false;
    }
    bVar17 = cVar9 != Gsmooth_continuous;
    iVar13 = 0;
    if (cVar9 != Cinfinity_continuous) {
      iVar13 = (bVar6 | 2) - iVar15;
    }
    span_index = ON_NurbsSpanIndex(iVar15,this->m_cv_count,this->m_knot,t0,(uint)(t0 <= t1) * 2 + -1
                                   ,*hint);
    pdVar11 = this->m_knot;
    dVar20 = (ABS(pdVar11[(long)span_index + 1] - pdVar11[span_index]) +
             ABS(pdVar11[(long)span_index + 1]) + ABS(pdVar11[span_index])) * 1.490116119385e-08;
    iVar15 = this->m_order;
    bVar2 = iVar15 < 4;
    iVar10 = span_index + iVar15;
    if (t1 <= t0) {
      if ((((0 < span_index) && (dVar1 = pdVar11[(long)iVar10 + -2], dVar1 < t0)) && (t1 < dVar1))
         && (t0 - dVar1 <= dVar20)) {
        span_index = ON_NurbsSpanIndex(iVar15,this->m_cv_count,pdVar11,dVar1,-1,*hint);
        dVar21 = dVar1;
      }
      if (bVar2 || bVar17) {
        bVar7 = false;
      }
      else {
        bVar7 = SpanIsLinear(this,span_index,1e-08,1e-08);
      }
      *hint = span_index;
      lVar14 = (long)this->m_order + -2;
      pdVar11 = this->m_knot;
      for (lVar16 = (long)(span_index + (int)lVar14); lVar14 < lVar16; lVar16 = lVar16 + -1) {
        if (pdVar11[lVar16] < dVar21) {
          iVar13 = -iVar13;
          lVar14 = -1;
          goto LAB_00593ed7;
        }
      }
      if (c == cVar9) {
        return false;
      }
      if (dVar21 <= pdVar11[(long)this->m_order + -2]) {
        return false;
      }
      if (pdVar11[(long)this->m_order + -2] <= t1) {
        return false;
      }
    }
    else {
      dVar1 = pdVar11[(long)iVar10 + -1];
      if (((t0 < dVar1) && (dVar1 < t1)) && ((dVar1 - t0 <= dVar20 && (iVar10 < this->m_cv_count))))
      {
        span_index = ON_NurbsSpanIndex(iVar15,this->m_cv_count,pdVar11,dVar1,1,*hint);
        dVar21 = dVar1;
      }
      if (bVar2 || bVar17) {
        bVar7 = false;
      }
      else {
        bVar7 = SpanIsLinear(this,span_index,1e-08,1e-08);
      }
      *hint = span_index;
      pdVar11 = this->m_knot;
      lVar14 = 1;
      for (lVar16 = (long)(this->m_order + span_index + -2); lVar16 < (long)this->m_cv_count + -1;
          lVar16 = lVar16 + 1) {
        if (dVar21 < pdVar11[lVar16]) goto LAB_00593ed7;
      }
      if (c == cVar9) {
        return false;
      }
      if (pdVar11[(long)this->m_cv_count + -1] <= dVar21) {
        return false;
      }
      if (t1 < pdVar11[(long)this->m_cv_count + -1]) {
        return false;
      }
    }
  }
  goto LAB_00593b60;
LAB_00593ed7:
  bVar12 = cVar9 != C2_continuous & bVar6;
  dVar20 = t1;
  if (dVar21 <= t1) {
    dVar20 = dVar21;
  }
  while( true ) {
    lVar16 = (long)(int)lVar16;
    dVar1 = pdVar11[lVar16];
    uVar18 = SUB84(dVar1,0);
    uVar19 = (undefined4)((ulong)dVar1 >> 0x20);
    if ((dVar1 <= dVar20) ||
       ((double)(~-(ulong)(t1 < dVar21) & (ulong)t1 | -(ulong)(t1 < dVar21) & (ulong)dVar21) <=
        dVar1)) break;
    if (t0 < t1) {
      lVar5 = lVar16;
      do {
        lVar16 = lVar5;
        if ((long)this->m_cv_count + -1 <= lVar16) goto LAB_00594472;
        dVar1 = pdVar11[lVar16 + 1];
        dVar3 = (double)CONCAT44(uVar19,uVar18);
        dVar4 = (double)CONCAT44(uVar19,uVar18);
        uVar18 = SUB84(dVar1,0);
        uVar19 = (undefined4)((ulong)dVar1 >> 0x20);
      } while ((dVar4 == dVar1) && (lVar5 = lVar16 + 1, !NAN(dVar3) && !NAN(dVar1)));
    }
    else {
      while( true ) {
        if (lVar16 <= (long)this->m_order + -2) goto LAB_00594472;
        if ((pdVar11[lVar16] != pdVar11[lVar16 + -1]) ||
           (NAN(pdVar11[lVar16]) || NAN(pdVar11[lVar16 + -1]))) break;
        lVar16 = lVar16 + -1;
      }
    }
    iVar15 = (int)lVar16;
    dVar1 = pdVar11[iVar15];
    uVar18 = SUB84(dVar1,0);
    uVar19 = (undefined4)((ulong)dVar1 >> 0x20);
    if ((dVar1 != pdVar11[iVar13 + iVar15]) || (NAN(dVar1) || NAN(pdVar11[iVar13 + iVar15])))
    goto LAB_00594465;
    if (cVar9 == Cinfinity_continuous) {
      *dtype = 3;
      goto LAB_005944b3;
    }
    if (bVar6 == false) {
      ON_Curve::Ev1Der(&this->super_ON_Curve,dVar1,&Pm,&D1m,-1,hint);
      ON_Curve::Ev1Der(&this->super_ON_Curve,this->m_knot[iVar15],&Pp,&D1p,1,hint);
      if (cVar9 == G1_continuous || bVar12 != 0) {
LAB_0059410f:
        Tm.z = D1m.z;
        Tm.x = D1m.x;
        Tm.y = D1m.y;
        Tp.x = D1p.x;
        Tp.y = D1p.y;
        Tp.z = D1p.z;
        ON_3dVector::Unitize(&Tm);
        ON_3dVector::Unitize(&Tp);
        goto LAB_0059416b;
      }
LAB_0059424d:
      ON_3dVector::operator-(&local_b0,&D1m,&D1p);
      dVar1 = ON_3dVector::MaximumCoordinate(&D1m);
      bVar8 = ON_3dVector::IsTiny(&local_b0,dVar1 * 1.490116119385e-08);
      if (bVar8) {
        if (bVar6 != false) {
          ON_3dVector::operator-(&local_b0,&D2m,&D2p);
          dVar1 = ON_3dVector::MaximumCoordinate(&D2m);
          bVar8 = ON_3dVector::IsTiny(&local_b0,dVar1 * 1.490116119385e-08);
          if (bVar8) goto LAB_00594465;
          goto LAB_0059449e;
        }
        goto LAB_00594465;
      }
LAB_00594496:
      *dtype = 1;
LAB_005944a4:
      uVar18 = SUB84(this->m_knot[iVar15],0);
      uVar19 = (undefined4)((ulong)this->m_knot[iVar15] >> 0x20);
LAB_005944b3:
      *t_00 = (double)CONCAT44(uVar19,uVar18);
      return true;
    }
    ON_Curve::Ev2Der(&this->super_ON_Curve,dVar1,&Pm,&D1m,&D2m,-1,hint);
    ON_Curve::Ev2Der(&this->super_ON_Curve,this->m_knot[iVar15],&Pp,&D1p,&D2p,1,hint);
    if (cVar9 != G1_continuous && bVar12 == 0) goto LAB_0059424d;
    if (bVar12 == 0) goto LAB_0059410f;
    ON_EvCurvature(&D1m,&D2m,&Tm,&Km);
    ON_EvCurvature(&D1p,&D2p,&Tp,&Kp);
LAB_0059416b:
    dVar1 = ON_3dVector::operator*(&Tm,&Tp);
    if (dVar1 < cos_angle_tolerance) goto LAB_00594496;
    if (bVar12 != 0) {
      if (cVar9 == Gsmooth_continuous) {
        Km_00.y = Km.y;
        Km_00.x = Km.x;
        Km_00.z = Km.z;
        Kp_00.y = Kp.y;
        Kp_00.x = Kp.x;
        Kp_00.z = Kp.z;
        bVar8 = ON_IsGsmoothCurvatureContinuous(Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance)
        ;
        if ((!bVar8) ||
           (bVar8 = ON_NurbsArcToArcTransitionIsNotGsmooth
                              (this,iVar15,cos_angle_tolerance,curvature_tolerance), bVar8))
        goto LAB_0059449e;
LAB_005943b2:
        if ((bVar2 || bVar17) ||
           (bVar8 = SpanIsLinear(this,((t0 < t1) + 1 + iVar15) - this->m_order,1e-08,1e-08),
           bVar7 == bVar8)) goto LAB_00594465;
        *dtype = 3;
      }
      else {
        Km_01.y = Km.y;
        Km_01.x = Km.x;
        Km_01.z = Km.z;
        Kp_01.y = Kp.y;
        Kp_01.x = Kp.x;
        Kp_01.z = Kp.z;
        bVar8 = ON_IsG2CurvatureContinuous(Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
        if (bVar8) goto LAB_005943b2;
LAB_0059449e:
        *dtype = 2;
      }
      goto LAB_005944a4;
    }
LAB_00594465:
    lVar16 = lVar16 + lVar14;
    pdVar11 = this->m_knot;
  }
LAB_00594472:
  if (c == cVar9) {
    return false;
  }
LAB_00593b60:
  bVar6 = ON_Curve::GetNextDiscontinuity
                    (&this->super_ON_Curve,c,dVar21,t1,t_00,hint,dtype,cos_angle_tolerance,
                     curvature_tolerance);
  return bVar6;
}

Assistant:

bool ON_NurbsCurve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  const double is_linear_tolerance = 1.0e-8;  
  const double is_linear_min_length = 1.0e-8;
  int tmp_hint = 0, tmp_dtype=0;
  double d, tmp_t;
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km(ON_3dVector::NanVector), Kp(ON_3dVector::NanVector);
  int ki;
  if ( !hint )
    hint = &tmp_hint;
  if ( !dtype )
    dtype = &tmp_dtype;
  if ( !t )
    t = &tmp_t;
  
  if ( c == ON::continuity::C0_continuous )
    return false;
  if ( c == ON::continuity::C0_locus_continuous )
  {
    return ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }
  if ( t0 == t1 )
    return false;

  // First test for parametric discontinuities.  If none are found
  // then we will look for locus discontinuities at ends
  if ( m_order <= 2 )
    c = ON::PolylineContinuity((int)c); // no need to check 2nd derivatives that are zero
  const ON::continuity input_c = c;
  c = ON::ParametricContinuity((int)c);
  bool bEv2ndDer    = (c == ON::continuity::C2_continuous || c == ON::continuity::G2_continuous || c == ON::continuity::Gsmooth_continuous) && (m_order>2);
  bool bTestKappa   = ( bEv2ndDer && c != ON::continuity::C2_continuous );
  bool bTestTangent = ( bTestKappa || c == ON::continuity::G1_continuous );

  int delta_ki = 1;
  int delta = ((bEv2ndDer) ? 3 : 2) - m_order; // delta <= 0
  if ( ON::continuity::Cinfinity_continuous == c )
    delta = 0;

  ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,(t0>t1)?-1:1,*hint);
  double segtol = (fabs(m_knot[ki]) + fabs(m_knot[ki+1]) + fabs(m_knot[ki+1]-m_knot[ki]))*ON_SQRT_EPSILON;

  const bool bLineWiggleTest = (c == ON::continuity::Gsmooth_continuous && m_order >= 4);
  bool bSpanIsLinear = false;

  if ( t0 < t1 )
  {
    int ii = ki+m_order-2;
    if ( t0 < m_knot[ii+1] && t1 > m_knot[ii+1] && (m_knot[ii+1]-t0) <= segtol && ii+2 < m_cv_count )
    {
      t0 = m_knot[ii+1];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki < m_cv_count-1 && m_knot[ki] <= t0) 
      ki++;
    if (ki >= m_cv_count-1) 
    {
      if ( input_c != c && t0 < m_knot[m_cv_count-1] && t1 >= m_knot[m_cv_count-1] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
  }
  else
  {
    // (t0 > t1) work backwards
    int ii = ki+m_order-2;
    if ( t0 > m_knot[ii] && t1 < m_knot[ii] && (t0-m_knot[ii]) <= segtol && ii > m_order-2 )
    {
      t0 = m_knot[ii];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,-1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki > m_order-2 && m_knot[ki] >= t0) 
      ki--;
    if (ki <= m_order-2) 
    {
      if ( input_c != c && t0 > m_knot[m_order-2] && t1 < m_knot[m_order-2] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
    delta_ki = -1;
    delta = -delta;
  }

  double search_domain[2];
  if ( t0 <= t1 )
  {
    search_domain[0] = t0;
    search_domain[1] = t1;
  }
  else
  {
    search_domain[0] = t1;
    search_domain[1] = t0;
  }

  while ( search_domain[0] < m_knot[ki] && m_knot[ki] < search_domain[1] ) 
  {
    if ( delta_ki > 0 )
    {
      // t0 < t1 case
      while (ki < m_cv_count-1 && m_knot[ki] == m_knot[ki+1])
        ki++;
      if (ki >= m_cv_count-1) 
        break;    
    }
    else
    {
      // t0 > t1 case
      // 20 March 2003 Dale Lear:
      //     Added to make t0 > t1 case work
      while (ki > m_order-2 && m_knot[ki] == m_knot[ki-1])
        ki--;
      if (ki <= m_order-2) 
        break;    
    }

    if (m_knot[ki] == m_knot[ki+delta]) 
    {  
      if ( ON::continuity::Cinfinity_continuous == c )
      {
        // Cinfinity_continuous is treated as asking for the next knot
        *dtype = 3;
        *t = m_knot[ki];
        return true;
      }

      if ( bEv2ndDer ) {
        Ev2Der( m_knot[ki], Pm, D1m, D2m, -1, hint );
        Ev2Der( m_knot[ki], Pp, D1p, D2p,  1, hint );
      }
      else {
        Ev1Der( m_knot[ki], Pm, D1m, -1, hint );
        Ev1Der( m_knot[ki], Pp, D1p,  1, hint );
      }

      if ( bTestTangent )
      {
        if ( bTestKappa )
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
        }
        
        d = Tm*Tp;
        if ( d < cos_angle_tolerance )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        
        if ( bTestKappa )
        {
          bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
                  ? ON_IsGsmoothCurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance )
                  : ON_IsG2CurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance );
          if ( bIsCurvatureContinuous && ON::continuity::Gsmooth_continuous == c )
          {
            if ( ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
              bIsCurvatureContinuous = false;
          }

          if ( !bIsCurvatureContinuous )
          {
            // NOTE:
            //   The test to enter this scope must exactly match
            //   the one used in ON_PolyCurve::GetNextDiscontinuity()
            //   and  ON_Curve::GetNextDiscontinuity().
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }
          if ( bLineWiggleTest )
          {
            if ( bSpanIsLinear != (( delta_ki < 0 )
                                  ? SpanIsLinear(ki - m_order + 1,is_linear_min_length,is_linear_tolerance)
                                  : SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance))
               )
            {
              // we are at a transition between a line segment and a wiggle
              *dtype = 3;
              *t = m_knot[ki];
              return true;
            }
          }
        }
      }
      else
      {
        if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        else if ( bEv2ndDer )
        {
          if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }         
        }
      }
    }
    ki += delta_ki;
  }

  // 20 March 2003 Dale Lear:
  //   If we get here, there are not discontinuities strictly between
  //   t0 and t1.
  bool rc = false;

  if ( input_c != c )
  {
    // use base class for consistent start/end locus testing 
    rc = ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }

  return rc;
}